

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

char * el::LevelHelper::convertToString(Level level)

{
  Level level_local;
  char *local_8;
  
  if (level == Global) {
    local_8 = "GLOBAL";
  }
  else if (level == Debug) {
    local_8 = "DEBUG";
  }
  else if (level == Info) {
    local_8 = "INFO";
  }
  else if (level == Warning) {
    local_8 = "WARNING";
  }
  else if (level == Error) {
    local_8 = "ERROR";
  }
  else if (level == Fatal) {
    local_8 = "FATAL";
  }
  else if (level == Verbose) {
    local_8 = "VERBOSE";
  }
  else if (level == Trace) {
    local_8 = "TRACE";
  }
  else {
    local_8 = "UNKNOWN";
  }
  return local_8;
}

Assistant:

const char* LevelHelper::convertToString(Level level) {
  // Do not use switch over strongly typed enums because Intel C++ compilers dont support them yet.
  if (level == Level::Global) return "GLOBAL";
  if (level == Level::Debug) return "DEBUG";
  if (level == Level::Info) return "INFO";
  if (level == Level::Warning) return "WARNING";
  if (level == Level::Error) return "ERROR";
  if (level == Level::Fatal) return "FATAL";
  if (level == Level::Verbose) return "VERBOSE";
  if (level == Level::Trace) return "TRACE";
  return "UNKNOWN";
}